

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile.cpp
# Opt level: O2

void __thiscall LogFile::RollFile(LogFile *this)

{
  time_t nowTime;
  WriteFile *this_00;
  LogFile *this_01;
  string sLogName;
  string local_58;
  string local_38;
  
  this_01 = (LogFile *)0x0;
  nowTime = time((time_t *)0x0);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  GetFileName(this_01,nowTime,&local_58);
  this_00 = (WriteFile *)operator_new(0x10010);
  std::__cxx11::string::string((string *)&local_38,(string *)&local_58);
  WriteFile::WriteFile(this_00,&local_38);
  std::__uniq_ptr_impl<WriteFile,_std::default_delete<WriteFile>_>::reset
            ((__uniq_ptr_impl<WriteFile,_std::default_delete<WriteFile>_> *)this,this_00);
  std::__cxx11::string::~string((string *)&local_38);
  this->m_cnt = 0;
  this->m_writedSize = 0;
  this->m_lastFlushTime = nowTime;
  this->m_lastRollTime = nowTime;
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void LogFile::RollFile()
{
	time_t nowTime = time(NULL);
	std::string sLogName;
	GetFileName(nowTime, sLogName);
	m_ptWriteFile.reset(new WriteFile(sLogName));
	m_cnt = 0;
	m_writedSize = 0;
	m_lastFlushTime = nowTime;
	m_lastRollTime = nowTime;
}